

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O1

int __thiscall
crnlib::command_line_params::get_value_as_int
          (command_line_params *this,char *pKey,uint index,int def,int l,int h,uint value_index)

{
  _Base_ptr p_Var1;
  bool bVar2;
  param_map_const_iterator pVar3;
  int val;
  uint local_34;
  _Base_ptr local_30;
  
  pVar3 = get_param(this,pKey,index);
  if (((_Rb_tree_header *)pVar3._M_node != &(this->m_param_map)._M_t._M_impl.super__Rb_tree_header)
     && (value_index < *(uint *)&pVar3._M_node[1]._M_right)) {
    p_Var1 = (&(pVar3._M_node[1]._M_left)->_M_parent)[(ulong)value_index * 2];
    local_30 = (_Base_ptr)"";
    if (p_Var1 != (_Base_ptr)0x0) {
      local_30 = p_Var1;
    }
    bVar2 = string_to_int((char **)&local_30,(int *)&local_34);
    if (bVar2) {
      if ((int)local_34 < l) {
        console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",
                         (ulong)local_34,pKey,(ulong)(uint)l);
        def = l;
      }
      else {
        def = local_34;
        if (h < (int)local_34) {
          console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i",
                           (ulong)local_34,pKey,(ulong)(uint)h);
          def = h;
        }
      }
    }
    else {
      console::warning("Invalid value specified for parameter \"%s\", using default value of %i",
                       pKey,(ulong)(uint)def);
    }
  }
  return def;
}

Assistant:

int command_line_params::get_value_as_int(const char* pKey, uint index, int def, int l, int h, uint value_index) const
    {
        param_map_const_iterator it = get_param(pKey, index);
        if ((it == end()) || (value_index >= it->second.m_values.size()))
        {
            return def;
        }

        int val;
        const char* p = it->second.m_values[value_index].get_ptr();
        if (!string_to_int(p, val))
        {
            crnlib::console::warning("Invalid value specified for parameter \"%s\", using default value of %i", pKey, def);
            return def;
        }

        if (val < l)
        {
            crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, l);
            val = l;
        }
        else if (val > h)
        {
            crnlib::console::warning("Value %i for parameter \"%s\" is out of range, clamping to %i", val, pKey, h);
            val = h;
        }

        return val;
    }